

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

size_t anon_unknown.dwarf_1ba3de::cmFileCommandCurlDebugCallback
                 (CURL *param_1,curl_infotype type,char *chPtr,size_t size,void *data)

{
  uint uVar1;
  char *__last;
  const_iterator __position;
  char buf [128];
  char acStack_88 [128];
  
  if (type - CURLINFO_DATA_IN < 4) {
    uVar1 = sprintf(acStack_88,"[%lu bytes data]\n",size);
    if ((int)uVar1 < 1) {
      return 0;
    }
    __position._M_current = *(char **)((long)data + 8);
    __last = acStack_88 + uVar1;
    chPtr = acStack_88;
  }
  else {
    if (CURLINFO_HEADER_OUT < type) {
      return 0;
    }
    __position._M_current = *(char **)((long)data + 8);
    __last = chPtr + size;
  }
  std::vector<char,std::allocator<char>>::insert<char*,void>
            ((vector<char,std::allocator<char>> *)data,__position,chPtr,__last);
  return 0;
}

Assistant:

static size_t
  cmFileCommandCurlDebugCallback(CURL *, curl_infotype type, char *chPtr,
                                 size_t size, void *data)
    {
    cmFileCommandVectorOfChar *vec
      = static_cast<cmFileCommandVectorOfChar*>(data);
    switch(type)
      {
      case CURLINFO_TEXT:
      case CURLINFO_HEADER_IN:
      case CURLINFO_HEADER_OUT:
        vec->insert(vec->end(), chPtr, chPtr + size);
        break;
      case CURLINFO_DATA_IN:
      case CURLINFO_DATA_OUT:
      case CURLINFO_SSL_DATA_IN:
      case CURLINFO_SSL_DATA_OUT:
        {
        char buf[128];
        int n = sprintf(buf, "[%" KWIML_INT_PRIu64 " bytes data]\n",
                        static_cast<KWIML_INT_uint64_t>(size));
        if (n > 0)
          {
          vec->insert(vec->end(), buf, buf + n);
          }
        }
        break;
      default:
        break;
      }
    return 0;
    }